

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ExprNew(Fts5Config *pConfig,int iCol,char *zExpr,Fts5Expr **ppNew,char **pzErr)

{
  int fts5yymajor;
  void *fts5yyp;
  Fts5Colset *pColset_00;
  Fts5Expr *pFVar1;
  Fts5ExprNode *pFVar2;
  Fts5Token fts5yyminor;
  bool local_a5;
  int nByte;
  Fts5Colset *pColset;
  int n;
  Fts5Expr *pNew;
  void *pEngine;
  char *pcStack_78;
  int t;
  char *z;
  Fts5Token token;
  Fts5Parse sParse;
  char **pzErr_local;
  Fts5Expr **ppNew_local;
  char *zExpr_local;
  int iCol_local;
  Fts5Config *pConfig_local;
  
  *ppNew = (Fts5Expr *)0x0;
  *pzErr = (char *)0x0;
  pcStack_78 = zExpr;
  sParse.pExpr = (Fts5ExprNode *)pzErr;
  memset(&token.n,0,0x28);
  fts5yyp = sqlite3Fts5ParserAlloc(fts5ParseAlloc);
  token._8_8_ = pConfig;
  if (fts5yyp == (void *)0x0) {
    pConfig_local._4_4_ = 7;
  }
  else {
    do {
      fts5yymajor = fts5ExprGetToken((Fts5Parse *)&token.n,&stack0xffffffffffffff88,(Fts5Token *)&z)
      ;
      fts5yyminor._12_4_ = 0;
      fts5yyminor.p = z;
      fts5yyminor.n = token.p._0_4_;
      sqlite3Fts5Parser(fts5yyp,fts5yymajor,fts5yyminor,(Fts5Parse *)&token.n);
      local_a5 = (int)sParse.zErr == 0 && fts5yymajor != 0;
    } while (local_a5);
    sqlite3Fts5ParserFree(fts5yyp,fts5ParseFree);
    if ((((iCol < pConfig->nCol) && (sParse.apPhrase != (Fts5ExprPhrase **)0x0)) &&
        ((int)sParse.zErr == 0)) &&
       (pColset_00 = (Fts5Colset *)sqlite3Fts5MallocZero((int *)&sParse.zErr,8),
       pColset_00 != (Fts5Colset *)0x0)) {
      pColset_00->nCol = 1;
      pColset_00->aiCol[0] = iCol;
      sqlite3Fts5ParseSetColset((Fts5Parse *)&token.n,(Fts5ExprNode *)sParse.apPhrase,pColset_00);
    }
    if ((int)sParse.zErr == 0) {
      pFVar1 = (Fts5Expr *)sqlite3_malloc(0x28);
      *ppNew = pFVar1;
      if (pFVar1 == (Fts5Expr *)0x0) {
        sParse.zErr._0_4_ = 7;
        sqlite3Fts5ParseNodeFree((Fts5ExprNode *)sParse.apPhrase);
      }
      else {
        if (sParse.apPhrase == (Fts5ExprPhrase **)0x0) {
          pFVar2 = (Fts5ExprNode *)sqlite3Fts5MallocZero((int *)&sParse.zErr,0x38);
          pFVar1->pRoot = pFVar2;
          if (pFVar1->pRoot != (Fts5ExprNode *)0x0) {
            pFVar1->pRoot->bEof = 1;
          }
        }
        else {
          pFVar1->pRoot = (Fts5ExprNode *)sParse.apPhrase;
        }
        pFVar1->pIndex = (Fts5Index *)0x0;
        pFVar1->pConfig = pConfig;
        pFVar1->apExprPhrase = (Fts5ExprPhrase **)sParse._16_8_;
        pFVar1->nPhrase = sParse.zErr._4_4_;
        sParse.rc = 0;
        sParse.nPhrase = 0;
      }
    }
    else {
      sqlite3Fts5ParseNodeFree((Fts5ExprNode *)sParse.apPhrase);
    }
    sqlite3_free((void *)sParse._16_8_);
    *(Fts5Config **)sParse.pExpr = sParse.pConfig;
    pConfig_local._4_4_ = (int)sParse.zErr;
  }
  return pConfig_local._4_4_;
}

Assistant:

static int sqlite3Fts5ExprNew(
  Fts5Config *pConfig,            /* FTS5 Configuration */
  int iCol,
  const char *zExpr,              /* Expression text */
  Fts5Expr **ppNew, 
  char **pzErr
){
  Fts5Parse sParse;
  Fts5Token token;
  const char *z = zExpr;
  int t;                          /* Next token type */
  void *pEngine;
  Fts5Expr *pNew;

  *ppNew = 0;
  *pzErr = 0;
  memset(&sParse, 0, sizeof(sParse));
  pEngine = sqlite3Fts5ParserAlloc(fts5ParseAlloc);
  if( pEngine==0 ){ return SQLITE_NOMEM; }
  sParse.pConfig = pConfig;

  do {
    t = fts5ExprGetToken(&sParse, &z, &token);
    sqlite3Fts5Parser(pEngine, t, token, &sParse);
  }while( sParse.rc==SQLITE_OK && t!=FTS5_EOF );
  sqlite3Fts5ParserFree(pEngine, fts5ParseFree);

  /* If the LHS of the MATCH expression was a user column, apply the
  ** implicit column-filter.  */
  if( iCol<pConfig->nCol && sParse.pExpr && sParse.rc==SQLITE_OK ){
    int n = sizeof(Fts5Colset);
    Fts5Colset *pColset = (Fts5Colset*)sqlite3Fts5MallocZero(&sParse.rc, n);
    if( pColset ){
      pColset->nCol = 1;
      pColset->aiCol[0] = iCol;
      sqlite3Fts5ParseSetColset(&sParse, sParse.pExpr, pColset);
    }
  }

  assert( sParse.rc!=SQLITE_OK || sParse.zErr==0 );
  if( sParse.rc==SQLITE_OK ){
    *ppNew = pNew = sqlite3_malloc(sizeof(Fts5Expr));
    if( pNew==0 ){
      sParse.rc = SQLITE_NOMEM;
      sqlite3Fts5ParseNodeFree(sParse.pExpr);
    }else{
      if( !sParse.pExpr ){
        const int nByte = sizeof(Fts5ExprNode);
        pNew->pRoot = (Fts5ExprNode*)sqlite3Fts5MallocZero(&sParse.rc, nByte);
        if( pNew->pRoot ){
          pNew->pRoot->bEof = 1;
        }
      }else{
        pNew->pRoot = sParse.pExpr;
      }
      pNew->pIndex = 0;
      pNew->pConfig = pConfig;
      pNew->apExprPhrase = sParse.apPhrase;
      pNew->nPhrase = sParse.nPhrase;
      sParse.apPhrase = 0;
    }
  }else{
    sqlite3Fts5ParseNodeFree(sParse.pExpr);
  }

  sqlite3_free(sParse.apPhrase);
  *pzErr = sParse.zErr;
  return sParse.rc;
}